

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_ManSetMapRefsGate(Nf_Man_t *p,int iObj,int Required,Nf_Mat_t *pM)

{
  uint i;
  Mio_Cell2_t *pMVar1;
  Jf_Par_t *pJVar2;
  uint uVar3;
  int *pCutSet;
  uint *puVar4;
  ulong uVar5;
  uint uVar6;
  byte bVar7;
  
  uVar3 = *(uint *)pM & 0xfffff;
  pMVar1 = p->pCells;
  pCutSet = Nf_ObjCutSet(p,iObj);
  puVar4 = (uint *)Nf_CutFromHandle(pCutSet,*(uint *)pM >> 0x14 & 0x3ff);
  bVar7 = 0;
  for (uVar5 = 0; uVar6 = *puVar4 & 0x1f, uVar5 < uVar6; uVar5 = uVar5 + 1) {
    i = puVar4[(ulong)(((uint)pM->Cfg >> 8) >> (bVar7 & 0x1f) & 0xf) + 1];
    if (i == 0) break;
    uVar6 = (uint)((((uint)pM->Cfg >> 1 & 0x7f) >> ((uint)uVar5 & 0x1f) & 1) != 0);
    Nf_ObjMapRefInc(p,i,uVar6);
    Nf_ObjUpdateRequired(p,i,uVar6,Required - pMVar1[uVar3].iDelays[uVar5]);
    bVar7 = bVar7 + 4;
  }
  if (uVar6 != *(uint *)&pMVar1[uVar3].field_0x10 >> 0x1c) {
    __assert_fail("Nf_CutSize(pCut) == (int)pCell->nFanins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x5ce,"void Nf_ManSetMapRefsGate(Nf_Man_t *, int, int, Nf_Mat_t *)");
  }
  pJVar2 = p->pPars;
  pJVar2->MapAreaF = pMVar1[uVar3].AreaF + pJVar2->MapAreaF;
  pJVar2->Area = pJVar2->Area + 1;
  pJVar2->Edge = (ulong)uVar6 + pJVar2->Edge;
  if (-1 < (int)*(uint *)pM) {
    *(uint *)pM = *(uint *)pM | 0x80000000;
    return;
  }
  __assert_fail("pM->fBest == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                ,0x5d4,"void Nf_ManSetMapRefsGate(Nf_Man_t *, int, int, Nf_Mat_t *)");
}

Assistant:

void Nf_ManSetMapRefsGate( Nf_Man_t * p, int iObj, int Required, Nf_Mat_t * pM )
{
    int k, iVar, fCompl;
    Mio_Cell2_t * pCell = Nf_ManCell( p, pM->Gate );
    int * pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, iObj), pM->CutH );
    Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
    {
        Nf_ObjMapRefInc( p, iVar, fCompl );
        Nf_ObjUpdateRequired( p, iVar, fCompl, Required - pCell->iDelays[k] );
    }
    assert( Nf_CutSize(pCut) == (int)pCell->nFanins );
    // update global stats
    p->pPars->MapAreaF += pCell->AreaF;
    p->pPars->Edge += Nf_CutSize(pCut);
    p->pPars->Area++;
    // update status of the gate
    assert( pM->fBest == 0 );
    pM->fBest = 1;
}